

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O1

bool slang::ast::OpInfo::isShortCircuit(BinaryOperator op)

{
  return op - LogicalAnd < 3;
}

Assistant:

bool OpInfo::isShortCircuit(BinaryOperator op) {
    switch (op) {
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
            return true;
        default:
            return false;
    }
}